

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cc
# Opt level: O0

void __thiscall flow::MatchHead::MatchHead(MatchHead *this,MatchDef *def,Program *program)

{
  bool bVar1;
  reference pMVar2;
  ConstantPool *this_00;
  FlowString *key;
  MatchCaseDef *one;
  const_iterator __end1;
  const_iterator __begin1;
  vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_> *__range1;
  Program *program_local;
  MatchDef *def_local;
  MatchHead *this_local;
  
  Match::Match(&this->super_Match,def);
  (this->super_Match)._vptr_Match = (_func_int **)&PTR__MatchHead_002d3a28;
  util::
  PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::PrefixTree(&this->map_);
  __end1 = std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>::begin(&def->cases);
  one = (MatchCaseDef *)
        std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>::end(&def->cases);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_flow::MatchCaseDef_*,_std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>_>
                                *)&one);
    if (!bVar1) break;
    pMVar2 = __gnu_cxx::
             __normal_iterator<const_flow::MatchCaseDef_*,_std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>_>
             ::operator*(&__end1);
    this_00 = Program::constants(program);
    key = ConstantPool::getString_abi_cxx11_(this_00,pMVar2->label);
    util::
    PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::insert(&this->map_,key,&pMVar2->pc);
    __gnu_cxx::
    __normal_iterator<const_flow::MatchCaseDef_*,_std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

MatchHead::MatchHead(const MatchDef& def, Program* program)
    : Match(def),
      map_() {
  for (const auto& one : def.cases) {
    map_.insert(program->constants().getString(one.label), one.pc);
  }
}